

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

bool amrex::anon_unknown_12::is<amrex::Box>(string *str,Box *val)

{
  bool bVar1;
  string left;
  istringstream s;
  byte abStack_170 [352];
  
  std::__cxx11::istringstream::istringstream((istringstream *)&s,(string *)str,_S_in);
  amrex::operator>>((istream *)&s,val);
  if ((abStack_170[*(long *)(_s + -0x18)] & 5) == 0) {
    left._M_dataplus._M_p = (pointer)&left.field_2;
    left._M_string_length = 0;
    left.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&s,(string *)&left);
    bVar1 = left._M_string_length == 0;
    std::__cxx11::string::~string((string *)&left);
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&s);
  return bVar1;
}

Assistant:

bool
is (const std::string& str, T& val)
{
    std::istringstream s(str);
    s >> val;
    if ( s.fail() ) return false;
    std::string left;
    std::getline(s, left);
    if ( !left.empty() ) return false;
    return true;
}